

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen_presplit.h
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>
          (PrimInfo *__return_storage_ptr__,sse2 *this,Scene *scene,GTypeMask types,bool mblur,
          size_t numPrimRefs,mvector<PrimRef> *prims,BuildProgressMonitor *progressMonitor)

{
  PrimInfo *pPVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  runtime_error *prVar5;
  ulong uVar6;
  ulong uVar7;
  size_t *psVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined1 *puVar12;
  undefined7 in_register_00000081;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 *puVar17;
  size_t taskCount_1;
  size_t taskCount;
  Iterator2 iter;
  anon_class_8_1_a89d07ac primitiveArea;
  anon_class_8_1_78f12065 split_primitive;
  TriangleSplitterFactory Splitter;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  anon_class_8_1_a89d07ac *in_stack_ffffffffffffd1e8;
  undefined1 *local_2e08;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2e00;
  sse2 *local_2df8;
  undefined1 *local_2df0;
  undefined1 *local_2de8;
  PrimInfo *local_2de0;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2dd8;
  sse2 *local_2dd0;
  undefined1 local_2dc8 [24];
  undefined1 *puStack_2db0;
  undefined1 local_2da8 [16];
  undefined1 local_2d98 [16];
  size_t local_2d88;
  size_t sStack_2d80;
  anon_class_8_1_898bcfc2_conflict5 local_2d70;
  undefined1 *local_2d68;
  sse2 *local_2d60;
  Scene *local_2d58;
  char local_2d50;
  MemoryMonitorInterface *local_2d48;
  undefined1 *local_2d40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2d38;
  undefined1 *local_2d30;
  undefined1 *local_2d28;
  anon_class_8_1_898bcfc2_conflict5 *local_2d20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2d18;
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  undefined8 local_2cf8;
  undefined8 uStack_2cf0;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  size_t local_2cd8;
  size_t sStack_2cd0;
  task_group_context local_2cc8;
  MemoryMonitorInterface local_2c48;
  long local_2c40 [63];
  ulong local_2a48 [64];
  undefined1 *local_2848;
  ulong local_2840;
  size_t local_13f8 [633];
  
  local_2df8 = (sse2 *)CONCAT71(in_register_00000081,mblur);
  cVar2 = (char)types;
  local_2848 = (undefined1 *)0x0;
  uVar10 = 0;
  local_2de0 = __return_storage_ptr__;
  local_2dd0 = this;
  local_2d60 = this;
  local_2d58 = scene;
  local_2d50 = cVar2;
  (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)();
  if (*(long *)(this + 0x1d8) != 0) {
    uVar10 = 0;
    lVar11 = 0;
    do {
      lVar13 = *(long *)(*(long *)(this + 0x1e8) + lVar11 * 8);
      if ((((lVar13 == 0) || ((*(uint *)(lVar13 + 0x3c) >> 0x15 & 1) == 0)) ||
          (((long)(1 << ((byte)*(uint *)(lVar13 + 0x3c) & 0x1f)) & (ulong)scene) == 0)) ||
         ((*(int *)(lVar13 + 0x24) == 1) == (bool)cVar2)) {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)*(uint *)(lVar13 + 0x20);
      }
      uVar10 = uVar10 + uVar6;
      lVar11 = lVar11 + 1;
    } while (*(long *)(this + 0x1d8) != lVar11);
  }
  local_2840 = uVar10;
  iVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar6 = uVar10 + 0x3ff >> 10;
  if ((ulong)(long)iVar3 < uVar6) {
    uVar6 = (long)iVar3;
  }
  uVar15 = 0x40;
  if (uVar6 < 0x40) {
    uVar15 = uVar6;
  }
  puVar17 = (undefined1 *)(uVar15 + (uVar15 == 0));
  local_2c48._vptr_MemoryMonitorInterface = (_func_int **)0x0;
  local_2a48[0] = 0;
  local_2848 = puVar17;
  if (1 < uVar6) {
    uVar15 = 0;
    uVar6 = uVar10 / (ulong)puVar17;
    lVar11 = *(long *)(this + 0x1e8);
    puVar12 = (undefined1 *)0x1;
    lVar13 = 0;
    do {
      lVar9 = *(long *)(lVar11 + lVar13 * 8);
      if (((lVar9 == 0) || ((*(uint *)(lVar9 + 0x3c) >> 0x15 & 1) == 0)) ||
         ((((long)(1 << ((byte)*(uint *)(lVar9 + 0x3c) & 0x1f)) & (ulong)scene) == 0 ||
          (((*(int *)(lVar9 + 0x24) == 1) == (bool)cVar2 ||
           (uVar14 = (ulong)*(uint *)(lVar9 + 0x20), uVar14 == 0)))))) {
        uVar14 = 0;
        lVar9 = 0;
      }
      else {
        uVar7 = (long)(puVar12 + 1) * uVar10;
        lVar9 = 0;
        uVar16 = 0;
        do {
          uVar4 = uVar6;
          uVar6 = uVar4;
          if ((uVar15 + uVar14 + lVar9 < uVar4) || (puVar17 <= puVar12)) break;
          local_2c40[(long)puVar12 + 0xffffffffffffffff] = lVar13;
          uVar16 = uVar16 + (uVar4 - uVar15);
          local_2a48[(long)puVar12] = uVar16;
          puVar12 = puVar12 + 1;
          uVar6 = uVar7 / (ulong)local_2848;
          lVar9 = -uVar16;
          uVar7 = uVar7 + uVar10;
          uVar15 = uVar4;
          puVar17 = local_2848;
        } while (uVar16 < uVar14);
      }
      uVar15 = uVar14 + uVar15 + lVar9;
      lVar13 = lVar13 + 1;
    } while (puVar12 < puVar17);
  }
  local_2d18._0_8_ = 0x7f8000007f800000;
  local_2d18._8_8_ = 0x7f8000007f800000;
  local_2d08 = 0xff800000ff800000;
  uStack_2d00 = 0xff800000ff800000;
  local_2cf8 = 0x7f8000007f800000;
  uStack_2cf0 = 0x7f8000007f800000;
  local_2ce8 = 0xff800000ff800000;
  uStack_2ce0 = 0xff800000ff800000;
  local_2cd8 = 0;
  sStack_2cd0 = 0;
  local_2d48 = (MemoryMonitorInterface *)&local_2df0;
  local_2dc8._8_8_ = &local_2de8;
  local_2dc8._0_8_ = &local_2c48;
  puStack_2db0 = (undefined1 *)&local_2e08;
  local_2dc8._16_8_ = &local_2d18;
  local_2da8._8_8_ = &local_2d48;
  local_2da8._0_8_ = &stack0xffffffffffffd1ee;
  local_2cc8.my_version = proxy_support;
  local_2cc8.my_traits = (context_traits)0x4;
  local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_2cc8.my_name = CUSTOM_CTX;
  local_2e08 = (undefined1 *)&local_2d60;
  local_2e00 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
               numPrimRefs;
  local_2df0 = (undefined1 *)numPrimRefs;
  local_2de8 = puVar17;
  local_2d40 = (undefined1 *)&local_2d60;
  tbb::detail::r1::initialize(&local_2cc8);
  local_2d70.func = (anon_class_48_6_afa08d2e *)local_2dc8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,(unsigned_long)puVar17,1,&local_2d70,(auto_partitioner *)&local_2dd8,&local_2cc8);
  cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
  if (cVar2 != '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"task cancelled");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_2cc8);
  local_2dc8._8_8_ = local_2d18._8_8_;
  local_2dc8._0_8_ = local_2d18._0_8_;
  puStack_2db0 = (undefined1 *)uStack_2d00;
  local_2dc8._16_8_ = local_2d08;
  local_2da8._8_8_ = uStack_2cf0;
  local_2da8._0_8_ = local_2cf8;
  local_2d98._8_8_ = uStack_2ce0;
  local_2d98._0_8_ = local_2ce8;
  sStack_2d80 = sStack_2cd0;
  local_2d88 = local_2cd8;
  if (local_2de8 != (undefined1 *)0x0) {
    psVar8 = local_13f8;
    puVar17 = local_2de8;
    do {
      *(undefined1 (*) [16])(psVar8 + -8) = local_2dc8._0_16_;
      *(undefined1 (*) [16])(psVar8 + -6) = register0x00001240;
      *(undefined1 (*) [16])(psVar8 + -4) = local_2da8;
      *(undefined1 (*) [16])(psVar8 + -2) = local_2d98;
      *psVar8 = local_2d88;
      psVar8[1] = sStack_2d80;
      local_2dc8._0_16_ = minps(local_2dc8._0_16_,*(undefined1 (*) [16])(psVar8 + -0x288));
      register0x00001240 = maxps(register0x00001240,*(undefined1 (*) [16])(psVar8 + -0x286));
      local_2da8 = minps(local_2da8,*(undefined1 (*) [16])(psVar8 + -0x284));
      local_2d98 = maxps(local_2d98,*(undefined1 (*) [16])(psVar8 + -0x282));
      local_2d88 = local_2d88 + psVar8[-0x280];
      sStack_2d80 = sStack_2d80 + psVar8[-0x27f];
      psVar8 = psVar8 + 10;
      puVar17 = (undefined1 *)((long)puVar17 + 0xffffffffffffffff);
    } while (puVar17 != (undefined1 *)0x0);
  }
  if ((sse2 *)(sStack_2d80 - local_2d88) != local_2df8) {
    (*(code *)((prims->alloc).device)->_vptr_MemoryMonitorInterface)(prims,0);
    puVar17 = local_2848;
    local_2d18._0_8_ = 0x7f8000007f800000;
    local_2d18._8_8_ = 0x7f8000007f800000;
    local_2d08 = 0xff800000ff800000;
    uStack_2d00 = 0xff800000ff800000;
    local_2cf8 = 0x7f8000007f800000;
    uStack_2cf0 = 0x7f8000007f800000;
    local_2ce8 = 0xff800000ff800000;
    uStack_2ce0 = 0xff800000ff800000;
    local_2cd8 = 0;
    sStack_2cd0 = 0;
    local_2dd8 = local_2e00;
    local_2e08 = local_2848;
    local_2d48 = &local_2c48;
    local_2d40 = (undefined1 *)&local_2e08;
    local_2d30 = (undefined1 *)&local_2df0;
    local_2d28 = &stack0xffffffffffffd1ef;
    local_2cc8.my_version = proxy_support;
    local_2cc8.my_traits = (context_traits)0x4;
    local_2cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_2cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_2cc8.my_name = CUSTOM_CTX;
    local_2df0 = (undefined1 *)&local_2d60;
    local_2d70.func = (anon_class_48_6_afa08d2e *)&local_2dd8;
    local_2d68 = (undefined1 *)&local_2d60;
    local_2d38 = &local_2d18;
    local_2d20 = &local_2d70;
    tbb::detail::r1::initialize(&local_2cc8);
    local_2de8 = (undefined1 *)&local_2d48;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,(unsigned_long)puVar17,1,(anon_class_8_1_898bcfc2_conflict5 *)&local_2de8,
               (auto_partitioner *)&stack0xffffffffffffd1ee,&local_2cc8);
    cVar2 = tbb::detail::r1::is_group_execution_cancelled(&local_2cc8);
    if (cVar2 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_2cc8);
    local_2dc8._8_8_ = local_2d18._8_8_;
    local_2dc8._0_8_ = local_2d18._0_8_;
    puStack_2db0 = (undefined1 *)uStack_2d00;
    local_2dc8._16_8_ = local_2d08;
    local_2da8._8_8_ = uStack_2cf0;
    local_2da8._0_8_ = local_2cf8;
    local_2d98._8_8_ = uStack_2ce0;
    local_2d98._0_8_ = local_2ce8;
    local_2d88 = local_2cd8;
    sStack_2d80 = sStack_2cd0;
    if (local_2e08 != (undefined1 *)0x0) {
      psVar8 = local_13f8;
      puVar17 = local_2e08;
      do {
        *(undefined1 (*) [16])(psVar8 + -8) = local_2dc8._0_16_;
        *(undefined1 (*) [16])(psVar8 + -6) = register0x00001280;
        *(undefined1 (*) [16])(psVar8 + -4) = local_2da8;
        *(undefined1 (*) [16])(psVar8 + -2) = local_2d98;
        *psVar8 = local_2d88;
        psVar8[1] = sStack_2d80;
        local_2dc8._0_16_ = minps(local_2dc8._0_16_,*(undefined1 (*) [16])(psVar8 + -0x288));
        register0x00001280 = maxps(register0x00001280,*(undefined1 (*) [16])(psVar8 + -0x286));
        local_2da8 = minps(local_2da8,*(undefined1 (*) [16])(psVar8 + -0x284));
        local_2d98 = maxps(local_2d98,*(undefined1 (*) [16])(psVar8 + -0x282));
        local_2d88 = local_2d88 + psVar8[-0x280];
        sStack_2d80 = sStack_2d80 + psVar8[-0x27f];
        psVar8 = psVar8 + 10;
        puVar17 = (undefined1 *)((long)puVar17 + 0xffffffffffffffff);
      } while (puVar17 != (undefined1 *)0x0);
    }
  }
  pPVar1 = local_2de0;
  local_2d48 = (MemoryMonitorInterface *)&local_2dd0;
  local_2d18._0_8_ = &local_2cc8;
  local_2cc8.my_cpu_ctl_env = (uint64_t)this;
  createPrimRefArray_presplit<embree::sse2::createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&,unsigned_int,embree::sse2::SplittingGrid_const&,embree::PrimRef*,unsigned_int&)_1_,embree::sse2::createPrimRefArray_presplit<embree::TriangleMesh,embree::sse2::TriangleSplitterFactory>(embree::Scene*,embree::Geometry::GTypeMask,bool,unsigned_long,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>&,embree::BuildProgressMonitor&)::_lambda(embree::PrimRef_const&)_1_,embree::vector_t<embree::PrimRef,embree::aligned_monitored_allocator<embree::PrimRef,32ul>>>
            (local_2de0,local_2df8,(size_t)local_2e00,
             (vector_t<embree::PrimRef,_embree::aligned_monitored_allocator<embree::PrimRef,_32UL>_>
              *)local_2dc8,(PrimInfo *)&local_2d18.field_1,(anon_class_8_1_78f12065 *)&local_2d48,
             in_stack_ffffffffffffd1e8);
  return pPVar1;
}

Assistant:

PrimInfo createPrimRefArray_presplit(Scene* scene, Geometry::GTypeMask types, bool mblur, size_t numPrimRefs, mvector<PrimRef>& prims, BuildProgressMonitor& progressMonitor)
    {
      ParallelForForPrefixSumState<PrimInfo> pstate;
      Scene::Iterator2 iter(scene,types,mblur);

      /* first try */
      progressMonitor(0);
      pstate.init(iter,size_t(1024));
      PrimInfo pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID) -> PrimInfo {
	  return mesh->createPrimRefArray(prims,r,k,(unsigned)geomID);
	}, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      
      /* if we need to filter out geometry, run again */
      if (pinfo.size() != numPrimRefs)
	{
	  progressMonitor(0);
	  pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](Geometry* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo {
	      return mesh->createPrimRefArray(prims,r,base.size(),(unsigned)geomID);
	    }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
	}


      SplitterFactory Splitter(scene);
        
      auto split_primitive = [&] (const PrimRef &prim,
                                  const unsigned int splitprims,
                                  const SplittingGrid& grid,
                                  PrimRef subPrims[MAX_PRESPLITS_PER_PRIMITIVE],
                                  unsigned int& numSubPrims)
      {
         const auto splitter = Splitter(prim);
         splitPrimitive(splitter,prim,splitprims,grid,subPrims,numSubPrims);
      };
      
      auto primitiveArea = [&] (const PrimRef &ref) {
        const unsigned int geomID = ref.geomID();
        const unsigned int primID = ref.primID();
        return ((Mesh*)scene->get(geomID))->projectedPrimitiveArea(primID);
      };
      
      return createPrimRefArray_presplit(numPrimRefs,prims,pinfo,split_primitive,primitiveArea);
    }